

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSimplexAnalysis.cpp
# Opt level: O2

void __thiscall HighsSimplexAnalysis::reportDensity(HighsSimplexAnalysis *this,bool header)

{
  EdgeWeightMode EVar1;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  undefined7 in_register_00000031;
  double density;
  string local_40;
  
  EVar1 = this->edge_weight_mode;
  if ((int)CONCAT71(in_register_00000031,header) != 0) {
    pbVar2 = (this->analysis_log)._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl;
    highsFormatToString_abi_cxx11_(&local_40," C_Aq R_Ep R_Ap");
    std::operator<<((ostream *)(pbVar2 + 0x10),(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    pbVar2 = (this->analysis_log)._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl + 0x10;
    if (EVar1 == kSteepestEdge) {
      highsFormatToString_abi_cxx11_(&local_40," S_Ed");
      std::operator<<((ostream *)pbVar2,(string *)&local_40);
    }
    else {
      highsFormatToString_abi_cxx11_(&local_40,"     ");
      std::operator<<((ostream *)pbVar2,(string *)&local_40);
    }
    std::__cxx11::string::~string((string *)&local_40);
    return;
  }
  reportOneDensity(this,this->col_aq_density);
  reportOneDensity(this,this->row_ep_density);
  reportOneDensity(this,this->row_ap_density);
  density = 0.0;
  if (EVar1 == kSteepestEdge) {
    if (this->simplex_strategy == 4) {
      density = this->col_steepest_edge_density;
    }
    else {
      density = this->row_DSE_density;
    }
  }
  reportOneDensity(this,density);
  return;
}

Assistant:

void HighsSimplexAnalysis::reportDensity(const bool header) {
  assert(analyse_simplex_runtime_data);
  const bool rp_steepest_edge =
      edge_weight_mode == EdgeWeightMode::kSteepestEdge;
  if (header) {
    *analysis_log << highsFormatToString(" C_Aq R_Ep R_Ap");
    if (rp_steepest_edge) {
      *analysis_log << highsFormatToString(" S_Ed");
    } else {
      *analysis_log << highsFormatToString("     ");
    }
  } else {
    reportOneDensity(col_aq_density);
    reportOneDensity(row_ep_density);
    reportOneDensity(row_ap_density);
    double use_steepest_edge_density;
    if (rp_steepest_edge) {
      if (simplex_strategy == kSimplexStrategyPrimal) {
        use_steepest_edge_density = col_steepest_edge_density;
      } else {
        use_steepest_edge_density = row_DSE_density;
      }
    } else {
      use_steepest_edge_density = 0;
    }
    reportOneDensity(use_steepest_edge_density);
  }
}